

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pillar.cpp
# Opt level: O3

bool EV_DoPillar(EPillar type,line_t_conflict *line,int tag,double speed,double height,
                double height2,int crush,bool hexencrush)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  DPillar *this;
  sector_t_conflict *this_00;
  bool bVar5;
  FSectorTagIterator itr;
  FSectorTagIterator local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (tag == 0) {
    local_50.searchtag = -0x80000000;
    local_50.start = -1;
    if ((line != (line_t_conflict *)0x0) && (line->backsector != (sector_t_conflict *)0x0)) {
      local_50.start = (int)((ulong)((long)line->backsector - (long)sectors) >> 3) * 0x7a44c6b;
    }
  }
  else {
    local_50.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
    local_50.searchtag = tag;
  }
  local_48 = speed;
  local_40 = height;
  local_38 = height2;
  uVar4 = FSectorTagIterator::Next(&local_50);
  bVar5 = false;
  if (-1 < (int)uVar4) {
    bVar5 = false;
    do {
      while( true ) {
        this_00 = sectors + uVar4;
        bVar3 = sector_t::PlaneMoving(this_00,0);
        if ((!bVar3) && (bVar3 = sector_t::PlaneMoving(this_00,1), !bVar3)) break;
        uVar4 = FSectorTagIterator::Next(&local_50);
        if ((int)uVar4 < 0) {
          return bVar5;
        }
      }
      dVar1 = (this_00->centerspot).X;
      dVar2 = (this_00->centerspot).Y;
      bVar3 = (this_00->floorplane).negiC *
              ((this_00->floorplane).normal.Y * dVar2 +
              (this_00->floorplane).normal.X * dVar1 + (this_00->floorplane).D) !=
              (this_00->ceilingplane).negiC *
              ((this_00->ceilingplane).normal.Y * dVar2 +
              (this_00->ceilingplane).normal.X * dVar1 + (this_00->ceilingplane).D);
      if ((type != pillarBuild || bVar3) && (type != pillarOpen || !bVar3)) {
        this = (DPillar *)
               M_Malloc_Dbg(0x88,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                            ,0x1f9);
        bVar5 = true;
        DPillar::DPillar(this,this_00,type,local_48,local_40,local_38,crush,hexencrush);
      }
      uVar4 = FSectorTagIterator::Next(&local_50);
    } while (-1 < (int)uVar4);
  }
  return bVar5;
}

Assistant:

bool EV_DoPillar (DPillar::EPillar type, line_t *line, int tag,
				  double speed, double height, double height2, int crush, bool hexencrush)
{
	int secnum;
	sector_t *sec;
	bool rtn = false;

	// check if a manual trigger; if so do just the sector on the backside
	FSectorTagIterator itr(tag, line);
	while ((secnum = itr.Next()) >= 0)
	{
		sec = &sectors[secnum];

		if (sec->PlaneMoving(sector_t::floor) || sec->PlaneMoving(sector_t::ceiling))
			continue;

		double flor, ceil;

		flor = sec->CenterFloor ();
		ceil = sec->CenterCeiling ();

		if (type == DPillar::pillarBuild && flor == ceil)
			continue;

		if (type == DPillar::pillarOpen && flor != ceil)
			continue;

		rtn = true;
		new DPillar (sec, type, speed, height, height2, crush, hexencrush);
	}
	return rtn;
}